

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::NetworkHttpClient::handleCleanup
          (NetworkHttpClient *this,
          map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
          *hosts,iterator iter)

{
  PromiseArena *pPVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  OwnPromiseNode OVar4;
  void *pvVar5;
  PromiseArena *in_RCX;
  HttpHeaderTable *pHVar6;
  OwnPromiseNode intermediate;
  undefined1 local_78 [16];
  OwnPromiseNode local_68;
  _Base_ptr local_60;
  PromiseArena *local_58;
  Duration local_50;
  SourceLocation local_48;
  
  pPVar1 = *(PromiseArena **)(in_RCX->bytes + 0x50);
  local_58 = (PromiseArena *)hosts;
  if (*(_func_int **)(pPVar1->bytes + 0x20) == (_func_int *)0x0) {
    local_60 = iter._M_node;
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)(local_78 + 8));
    uVar3 = local_78._8_8_;
    pPVar2 = *(PromiseArena **)(local_78._8_8_ + 8);
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_78._8_8_ - (long)pPVar2) < 0x30) {
      pvVar5 = operator_new(0x400);
      pHVar6 = (HttpHeaderTable *)((long)pvVar5 + 0x3d0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)pHVar6,(OwnPromiseNode *)(local_78 + 8),
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6200:39),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6202:10)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d0) = &PTR_destroy_007047c8;
      *(PromiseArena **)((long)pvVar5 + 0x3f0) = pPVar1;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = pPVar1;
      *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
    }
    else {
      *(PromiseArena **)(local_78._8_8_ + 8) = (PromiseArena *)0x0;
      pHVar6 = (HttpHeaderTable *)(local_78._8_8_ + -0x30);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)pHVar6,(OwnPromiseNode *)(local_78 + 8),
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6200:39),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6202:10)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_007047c8;
      ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
      ((PromiseArenaMember *)(uVar3 + -0x10))->arena = pPVar1;
      ((PromiseArenaMember *)(uVar3 + -0x30))->arena = pPVar2;
    }
    iter._M_node = local_60;
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    local_48.function = "onDrained";
    local_48.lineNumber = 0x1838;
    local_48.columnNumber = 0xe;
    local_68.ptr = (PromiseNode *)pHVar6;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,&local_68,&local_48);
    OVar4.ptr = local_68.ptr;
    local_78._0_8_ = local_50.value;
    if ((HttpHeaderTable *)local_68.ptr != (HttpHeaderTable *)0x0) {
      local_68.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
    }
    uVar3 = local_78._8_8_;
    if ((PromiseArenaMember *)local_78._8_8_ != (PromiseArenaMember *)0x0) {
      local_78._8_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
  }
  else {
    NetworkAddressHttpClient::onDrained((NetworkAddressHttpClient *)local_78);
  }
  uVar3 = local_78._0_8_;
  pPVar1 = *(PromiseArena **)(local_78._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_78._0_8_ - (long)pPVar1) < 0x38) {
    pvVar5 = operator_new(0x400);
    pHVar6 = (HttpHeaderTable *)((long)pvVar5 + 0x3c8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pHVar6,(OwnPromiseNode *)local_78,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6442:15)>
               ::anon_class_24_3_c36c7980_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3c8) = &PTR_destroy_00704820;
    *(PromiseArena **)((long)pvVar5 + 1000) = local_58;
    *(_Base_ptr *)((long)pvVar5 + 0x3f0) = iter._M_node;
    *(PromiseArena **)((long)pvVar5 + 0x3f8) = in_RCX;
    *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
  }
  else {
    *(PromiseArena **)(local_78._0_8_ + 8) = (PromiseArena *)0x0;
    pHVar6 = (HttpHeaderTable *)(local_78._0_8_ + -0x38);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pHVar6,(OwnPromiseNode *)local_78,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6442:15)>
               ::anon_class_24_3_c36c7980_for_func::operator());
    *(undefined ***)(uVar3 + -0x38) = &PTR_destroy_00704820;
    *(PromiseArena **)(uVar3 + -0x18) = local_58;
    ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)iter._M_node;
    *(PromiseArena **)(uVar3 + -8) = in_RCX;
    ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_68.ptr = (PromiseNode *)pHVar6;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_68,&local_48);
  OVar4.ptr = local_68.ptr;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)local_50.value;
  if ((HttpHeaderTable *)local_68.ptr != (HttpHeaderTable *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  uVar3 = local_78._0_8_;
  if ((PromiseArenaMember *)local_78._0_8_ != (PromiseArenaMember *)0x0) {
    local_78._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleCleanup(std::map<kj::StringPtr, Host>& hosts,
                                  std::map<kj::StringPtr, Host>::iterator iter) {
    return iter->second.client->onDrained()
        .then([this,&hosts,iter]() -> kj::Promise<void> {
      // Double-check that it's really drained to avoid race conditions.
      if (iter->second.client->isDrained()) {
        hosts.erase(iter);
        return kj::READY_NOW;
      } else {
        return handleCleanup(hosts, iter);
      }
    });
  }